

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicType.cpp
# Opt level: O2

DynamicType *
Js::DynamicType::New
          (ScriptContext *scriptContext,TypeId typeId,RecyclableObject *prototype,
          JavascriptMethod entryPoint,DynamicTypeHandler *typeHandler,bool isLocked,bool isShared)

{
  Recycler *alloc;
  DynamicType *this;
  undefined7 in_register_00000089;
  undefined1 local_68 [8];
  TrackAllocData data;
  
  data._33_7_ = in_register_00000089;
  data.line._0_1_ = isLocked;
  local_68 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_98f4aea;
  data.filename._0_4_ = 0x25;
  alloc = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_68);
  this = (DynamicType *)new<Memory::Recycler>(0x38,alloc,0x37a1d4);
  DynamicType(this,scriptContext,typeId,prototype,entryPoint,typeHandler,data.line._0_1_,isShared);
  return this;
}

Assistant:

DynamicType *
    DynamicType::New(ScriptContext* scriptContext, TypeId typeId, RecyclableObject* prototype, JavascriptMethod entryPoint, DynamicTypeHandler * typeHandler, bool isLocked, bool isShared)
    {
        return RecyclerNew(scriptContext->GetRecycler(), DynamicType, scriptContext, typeId, prototype, entryPoint, typeHandler, isLocked, isShared);
    }